

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O1

void __thiscall cmCursesBoolWidget::SetValueAsBool(cmCursesBoolWidget *this,bool value)

{
  undefined7 in_register_00000031;
  long *local_30 [2];
  long local_20 [2];
  
  local_30[0] = local_20;
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"OFF","");
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_30);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"ON","");
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_30);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void cmCursesBoolWidget::SetValueAsBool(bool value)
{
  if (value)
    {
    this->SetValue("ON");
    }
  else
    {
    this->SetValue("OFF");
    }
}